

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

int __thiscall Sudoku::doplnK(Sudoku *this,int x,int y,int cislo)

{
  byte bVar1;
  int iVar2;
  uint zakazano;
  int cislo_local;
  int y_local;
  int x_local;
  Sudoku *this_local;
  
  if ((((-1 < x) && (x < 9)) && (-1 < y)) && (y < 9)) {
    if ((*(byte *)((this->s).pole + (y * 9 + x)) >> 4 & 1) != 0) {
      return 0;
    }
    bVar1 = (byte)cislo;
    if ((1 << (bVar1 & 0x1f) &
        (((this->s).radky[y] | (this->s).sloupce[x] | (this->s).ctverce[x / 3][y / 3]) ^ 0xffffffff)
        ) != 0) {
      iVar2 = y * 9 + x;
      *(byte *)((this->s).pole + iVar2) = *(byte *)((this->s).pole + iVar2) & 0xf0 | bVar1 & 0xf;
      (this->s).radky[y] = 1 << (bVar1 & 0x1f) | (this->s).radky[y];
      (this->s).sloupce[x] = 1 << (bVar1 & 0x1f) | (this->s).sloupce[x];
      (this->s).ctverce[x / 3][y / 3] = 1 << (bVar1 & 0x1f) | (this->s).ctverce[x / 3][y / 3];
      (this->s).doplnenych = (this->s).doplnenych + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

int Sudoku::doplnK (int x, int y, int cislo)
{
  if(0 <= x && x < 9)
  {
    if(0 <= y && y < 9)
    {
      if(s.pole[y*9+x].pevne)// pevna cisla nelze prepisovat
        return false;
      unsigned int zakazano = s.radky[y] | s.sloupce[x] | s.ctverce[x/3][y/3];
      if((1 << cislo) & ~zakazano) // pokud nelze doplnit, koncime
      {
        s.pole[y*9+x].zapsane = cislo;
        // zakazeme pouzit cislo v radku, sloupci a ctverci
        s.radky[y] |= (1 << cislo);
        s.sloupce[x] |= (1 << cislo);
        s.ctverce[x/3][y/3] |= (1 << cislo);
        s.doplnenych++;
        return true;
      }
    }
  }
  return false;
}